

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

size_type __thiscall
google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>
::erase<std::__cxx11::string>
          (Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue> *this,
          key_arg<std::__cxx11::basic_string<char>_> *key)

{
  iterator it;
  bool bVar1;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_unsigned_long>
  local_58;
  iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
  local_30;
  
  InnerMap::FindHelper<std::__cxx11::string>(&local_58,this,key,(TreeIterator *)0x0);
  bVar1 = local_58.first.node_ != (Node *)0x0;
  if (bVar1) {
    local_30.node_ = local_58.first.node_;
    local_30.m_ = local_58.first.m_;
    local_30.bucket_index_ = local_58.first.bucket_index_;
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
    ::InnerMap::
    iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
    ::operator++(&local_30);
    it.m_ = local_58.first.m_;
    it.node_ = local_58.first.node_;
    it.bucket_index_ = local_58.first.bucket_index_;
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
    ::InnerMap::erase((InnerMap *)this,it);
  }
  return (ulong)bVar1;
}

Assistant:

size_type erase(const key_arg<K>& key) {
    iterator it = find(key);
    if (it == end()) {
      return 0;
    } else {
      erase(it);
      return 1;
    }
  }